

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_unmask_frame(ws_frame *frame)

{
  ulong local_18;
  size_t i;
  ws_frame *frame_local;
  
  if ((frame->masked & 1U) != 0) {
    for (local_18 = 0; local_18 < frame->len; local_18 = local_18 + 1) {
      frame->buf[local_18] = frame->buf[local_18] ^ frame->mask[local_18 & 3];
    }
    frame->hlen = frame->hlen - 4;
    frame->head[1] = frame->head[1] & 0x7f;
    frame->masked = false;
  }
  return;
}

Assistant:

static void
ws_unmask_frame(ws_frame *frame)
{
	// frames sent by client need mask.
	if (!frame->masked) {
		return;
	}
	for (size_t i = 0; i < frame->len; i++) {
		frame->buf[i] ^= frame->mask[i % 4];
	}
	frame->hlen -= 4;
	frame->head[1] &= 0x7f; // clear masked bit
	frame->masked = false;
}